

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.h
# Opt level: O1

void __thiscall Js::ArgumentReader::AdjustArguments(ArgumentReader *this,CallInfo *callInfo)

{
  undefined1 *puVar1;
  Type TVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  if (((ulong)(this->super_Arguments).Info & 0x48000000) == 0x40000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/Arguments.h"
                                ,0x121,
                                "(!this->HasNewTarget() || (Info.Flags & Js::CallFlags_ExtraArg))",
                                "NewTarget flag must be used together with ExtraArg.");
    if (!bVar4) goto LAB_0040562d;
    *puVar5 = 0;
  }
  TVar2 = (this->super_Arguments).Info;
  if ((TVar2._0_4_ >> 0x1b & 1) != 0) {
    if (((ulong)TVar2 & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/Arguments.h"
                                  ,0x126,"(Info.Count > 0)","Info.Count > 0");
      if (!bVar4) {
LAB_0040562d:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    puVar1 = &(this->super_Arguments).Info.field_0x3;
    *puVar1 = *puVar1 & 0xf7;
    callInfo->field_0x3 = callInfo->field_0x3 & 0xf7;
  }
  return;
}

Assistant:

void AdjustArguments(CallInfo *callInfo)
        {
            AssertMsg(!this->HasNewTarget() || (Info.Flags & Js::CallFlags_ExtraArg), "NewTarget flag must be used together with ExtraArg.");
            if (Info.Flags & Js::CallFlags_ExtraArg)
            {
                // If "calling eval" is set, then the last param is the frame display, which only
                // the eval built-in should see.
                Assert(Info.Count > 0);
                // The local version should be consistent. On the other hand, lots of code throughout
                // jscript uses the callInfo from stack to get argument list etc. We'll need
                // to change all the caller to be aware of the id or somehow make sure they don't use
                // the stack version. Both seem risky. It would be safer and more robust to just
                // change the stack version.
                Info.Flags = (CallFlags)(Info.Flags & ~Js::CallFlags_ExtraArg);
                callInfo->Flags = (CallFlags)(callInfo->Flags & ~Js::CallFlags_ExtraArg);
            }
        }